

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpAggregator.cpp
# Opt level: O1

void __thiscall HighsLpAggregator::addRow(HighsLpAggregator *this,HighsInt row,double weight)

{
  ulong uVar1;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  HighsInt len;
  HighsInt *inds;
  double *vals;
  uint local_4c;
  HighsInt *local_48;
  double *local_40;
  undefined1 local_38 [16];
  
  local_38._8_4_ = in_XMM0_Dc;
  local_38._0_8_ = weight;
  local_38._12_4_ = in_XMM0_Dd;
  HighsLpRelaxation::LpRow::get
            ((this->lprelaxation->lprows).
             super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
             ._M_impl.super__Vector_impl_data._M_start + row,this->lprelaxation->mipsolver,
             (HighsInt *)&local_4c,&local_48,&local_40);
  if (local_4c != 0) {
    uVar1 = 0;
    do {
      HighsSparseVectorSum::add
                (&this->vectorsum,local_48[uVar1],local_40[uVar1] * (double)local_38._0_8_);
      uVar1 = uVar1 + 1;
    } while (uVar1 != local_4c);
  }
  HighsSparseVectorSum::add
            (&this->vectorsum,row + (this->lprelaxation->lpsolver).model_.lp_.num_col_,
             -local_38._0_8_);
  return;
}

Assistant:

void HighsLpAggregator::addRow(HighsInt row, double weight) {
  HighsInt len;
  const double* vals;
  const HighsInt* inds;
  lprelaxation.getRow(row, len, inds, vals);

  for (HighsInt i = 0; i != len; ++i) vectorsum.add(inds[i], weight * vals[i]);

  vectorsum.add(lprelaxation.getLp().num_col_ + row, -weight);
}